

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O3

void trimCodes(string *code,string *qual,int overlap,int *rightNonOverlapGCCount,
              bool hasRightOverlap)

{
  char cVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  string prevCount;
  string rightNonOverlap;
  string returnQual;
  string returnCode;
  char *local_e8;
  char *local_e0;
  char local_d8 [16];
  string *local_c8;
  ulong local_c0;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  int *local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"0","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
  local_b8 = local_a8;
  local_98 = rightNonOverlapGCCount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  if (code->_M_string_length != 0) {
    uVar8 = 0;
    local_c0 = 0;
    local_c8 = code;
    do {
      __nptr = local_e8;
      cVar1 = (code->_M_dataplus)._M_p[uVar8];
      if ((cVar1 == 'O') || (cVar1 == 'C')) {
        piVar2 = __errno_location();
        iVar7 = *piVar2;
        *piVar2 = 0;
        lVar3 = strtol(__nptr,local_50,10);
        code = local_c8;
        if (local_50[0] == __nptr) {
          std::__throw_invalid_argument("stoi");
LAB_0015bca8:
          uVar4 = std::__throw_out_of_range("stoi");
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8);
          }
          _Unwind_Resume(uVar4);
        }
        if (((int)lVar3 != lVar3) || (*piVar2 == 0x22)) goto LAB_0015bca8;
        if (*piVar2 == 0) {
          *piVar2 = iVar7;
        }
        uVar5 = (int)local_c0 + (int)lVar3 + 2;
        if (overlap <= (int)uVar5) {
          if (hasRightOverlap) {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_c8);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)local_50);
            piVar2 = local_98;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            if (local_b0 == 0) {
              iVar7 = 0;
            }
            else {
              lVar3 = 0;
              iVar6 = 0;
              do {
                iVar6 = iVar6 + (uint)(local_b8[lVar3] == 'O');
                lVar3 = lVar3 + 1;
              } while (local_b0 != lVar3);
              lVar3 = 0;
              iVar7 = 0;
              do {
                iVar7 = iVar7 + (uint)(local_b8[lVar3] == 'C');
                lVar3 = lVar3 + 1;
              } while (local_b0 != lVar3);
              iVar7 = iVar7 + iVar6;
            }
            *piVar2 = iVar7;
          }
          break;
        }
        local_c0 = (ulong)uVar5;
        std::__cxx11::string::_M_append((char *)local_70,(ulong)local_e8);
        code = local_c8;
        if (local_c8->_M_string_length <= uVar8) {
LAB_0015bc8b:
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar8);
        }
        std::__cxx11::string::push_back((char)local_70);
        std::__cxx11::string::_M_append((char *)local_90,(ulong)local_e8);
        if (qual->_M_string_length <= uVar8) goto LAB_0015bc8b;
        std::__cxx11::string::push_back((char)local_90);
        std::__cxx11::string::_M_replace((ulong)&local_e8,0,local_e0,0x198db0);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_e8);
        if (iVar7 == 0) {
          if (code->_M_string_length <= uVar8) goto LAB_0015bc8b;
          std::__cxx11::string::_M_replace_aux((ulong)&local_e8,0,(ulong)local_e0,'\x01');
        }
        else {
          if (code->_M_string_length <= uVar8) goto LAB_0015bc8b;
          std::__cxx11::string::push_back((char)&local_e8);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < code->_M_string_length);
  }
  std::__cxx11::string::_M_assign((string *)code);
  std::__cxx11::string::_M_assign((string *)qual);
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  return;
}

Assistant:

void trimCodes(string & code, string & qual, int overlap, int & rightNonOverlapGCCount, bool hasRightOverlap){

    int i = 0;
    string prevCount="0";
    int distance = 0;
    string returnCode = "";
    string returnQual = "";
    string rightNonOverlap = "";
    while(i<code.size()){
        if(code.at(i)=='O' || code.at(i)=='C'){
            distance += stoi(prevCount);
            distance += 2;
            if(distance>=overlap){
                if(hasRightOverlap){
                    rightNonOverlap = code.substr(i,(code.size()-i));
                    int noOs= std::count(rightNonOverlap.begin(), rightNonOverlap.end(), 'O');
                    int noCs= std::count(rightNonOverlap.begin(), rightNonOverlap.end(), 'C');
                    rightNonOverlapGCCount = noOs + noCs;
                }
                break;
            }
            returnCode += prevCount;
            returnCode += code.at(i);
            returnQual += prevCount;
            returnQual += qual.at(i);
            prevCount = "0";
        }else{
            if(prevCount=="0"){
                prevCount = code.at(i);
            }else{
                prevCount += code.at(i);
            }
        }
        i++;
    }
    code = returnCode;
    qual = returnQual;
}